

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O3

bool __thiscall
iDynTree::Model::addAdditionalFrameToLink
          (Model *this,string *linkName,string *frameName,Transform *link_H_frame)

{
  pointer pcVar1;
  iterator __position;
  bool bVar2;
  LinkIndex LVar3;
  long *plVar4;
  long *plVar5;
  size_type *psVar6;
  string error;
  LinkIndex linkIndex;
  long *local_e0;
  long local_d0;
  long lStack_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  Transform *local_a0;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  LinkIndex local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  LVar3 = getLinkIndex(this,linkName);
  local_78 = LVar3;
  if (LVar3 == LINK_INVALID_INDEX) {
    std::operator+(&local_70,"error adding frame ",frameName);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_70);
    plVar5 = plVar4 + 2;
    if ((long *)*plVar4 == plVar5) {
      local_88 = *plVar5;
      lStack_80 = plVar4[3];
      local_98 = &local_88;
    }
    else {
      local_88 = *plVar5;
      local_98 = (long *)*plVar4;
    }
    local_90 = plVar4[1];
    *plVar4 = (long)plVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_98,(ulong)(linkName->_M_dataplus)._M_p);
    psVar6 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_c0.field_2._M_allocated_capacity = *psVar6;
      local_c0.field_2._8_8_ = plVar4[3];
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    }
    else {
      local_c0.field_2._M_allocated_capacity = *psVar6;
      local_c0._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_c0._M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_c0);
    plVar5 = plVar4 + 2;
    if ((long *)*plVar4 == plVar5) {
      local_d0 = *plVar5;
      lStack_c8 = plVar4[3];
      local_e0 = &local_d0;
    }
    else {
      local_d0 = *plVar5;
      local_e0 = (long *)*plVar4;
    }
    *plVar4 = (long)plVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    if (local_98 != &local_88) {
      operator_delete(local_98,local_88 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    iDynTree::reportError("Model","addAdditionalFrameToLink",(char *)local_e0);
    if (local_e0 == &local_d0) {
      return false;
    }
  }
  else {
    pcVar1 = (frameName->_M_dataplus)._M_p;
    local_a0 = link_H_frame;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar1,pcVar1 + frameName->_M_string_length);
    bVar2 = isFrameNameUsed(this,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (!bVar2) {
      std::vector<iDynTree::Transform,_std::allocator<iDynTree::Transform>_>::push_back
                (&this->additionalFrames,local_a0);
      __position._M_current =
           (this->additionalFramesLinks).super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->additionalFramesLinks).super__Vector_base<long,_std::allocator<long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                  ((vector<long,std::allocator<long>> *)&this->additionalFramesLinks,__position,
                   &local_78);
      }
      else {
        *__position._M_current = LVar3;
        (this->additionalFramesLinks).super__Vector_base<long,_std::allocator<long>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->frameNames,frameName);
      return true;
    }
    std::operator+(&local_c0,"a link or frame of name ",frameName);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_c0);
    plVar5 = plVar4 + 2;
    if ((long *)*plVar4 == plVar5) {
      local_d0 = *plVar5;
      lStack_c8 = plVar4[3];
      local_e0 = &local_d0;
    }
    else {
      local_d0 = *plVar5;
      local_e0 = (long *)*plVar4;
    }
    *plVar4 = (long)plVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    iDynTree::reportError("Model","addAdditionalFrameToLink",(char *)local_e0);
    if (local_e0 == &local_d0) {
      return false;
    }
  }
  operator_delete(local_e0,local_d0 + 1);
  return false;
}

Assistant:

bool Model::addAdditionalFrameToLink(const std::string& linkName,
                                     const std::string& frameName,
                                     Transform link_H_frame)
{
    // Check that the link actually exist
    LinkIndex linkIndex = this->getLinkIndex(linkName);
    if( linkIndex == LINK_INVALID_INDEX )
    {
        std::string error = "error adding frame " + frameName + " : a link of name "
                            + linkName + " is not present in the model";
        reportError("Model","addAdditionalFrameToLink",error.c_str());
        return false;
    }

    // Check that the frame name is not already used by a link or frame
    if(isFrameNameUsed(frameName))
    {
        std::string error = "a link or frame of name " + frameName + " is already present in the model";
        reportError("Model","addAdditionalFrameToLink",error.c_str());
        return false;
    }

    // If all error has passed, actually add the frame
    assert(additionalFrames.size() == additionalFramesLinks.size());
    assert(additionalFrames.size() == frameNames.size());
    this->additionalFrames.push_back(link_H_frame);
    this->additionalFramesLinks.push_back(linkIndex);
    this->frameNames.push_back(frameName);

    return true;
}